

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::ExpressionsIndexingArray1<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsIndexingArray1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *pTVar1;
  string *local_2d8;
  undefined1 *local_208;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  ulong local_198;
  size_t string_index;
  allocator<char> local_188;
  allocator<char> local_187;
  allocator<char> local_186;
  allocator<char> local_185;
  allocator<char> local_184;
  allocator<char> local_183;
  allocator<char> local_182;
  allocator<char> local_181;
  string *local_180;
  string local_178 [8];
  string variable_initializations [8];
  allocator<char> local_59;
  undefined1 local_58 [8];
  string variable_declaration;
  string shader_source;
  TestShaderType tested_shader_type_local;
  ExpressionsIndexingArray1<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  std::__cxx11::string::string((string *)(variable_declaration.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,"float x[1][1][1][1][1][1][1][1];\n\n",&local_59);
  std::allocator<char>::~allocator(&local_59);
  string_index._7_1_ = 1;
  local_180 = local_178;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,
             "x[0]                      = float[1][1][1][1][1][1][1](float[1][1][1][1][1][1](float[1][1][1][1][1](float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0)))))));\n"
             ,&local_181);
  local_180 = (string *)(variable_initializations[0].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_initializations[0].field_2._M_local_buf + 8),
             "x[0][0]                   = float[1][1][1][1][1][1](float[1][1][1][1][1](float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0))))));\n"
             ,&local_182);
  local_180 = (string *)(variable_initializations[1].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_initializations[1].field_2._M_local_buf + 8),
             "x[0][0][0]                = float[1][1][1][1][1](float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0)))));\n"
             ,&local_183);
  local_180 = (string *)(variable_initializations[2].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_initializations[2].field_2._M_local_buf + 8),
             "x[0][0][0][0]             = float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0))));\n"
             ,&local_184);
  local_180 = (string *)(variable_initializations[3].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_initializations[3].field_2._M_local_buf + 8),
             "x[0][0][0][0][0]          = float[1][1][1](float[1][1](float[1](1.0)));\n",&local_185)
  ;
  local_180 = (string *)(variable_initializations[4].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_initializations[4].field_2._M_local_buf + 8),
             "x[0][0][0][0][0][0]       = float[1][1](float[1](1.0));\n",&local_186);
  local_180 = (string *)(variable_initializations[5].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_initializations[5].field_2._M_local_buf + 8),
             "x[0][0][0][0][0][0][0]    = float[1](1.0);\n",&local_187);
  local_180 = (string *)(variable_initializations[6].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_initializations[6].field_2._M_local_buf + 8),
             "x[0][0][0][0][0][0][0][0] = 1.0;\n",&local_188);
  string_index._7_1_ = 0;
  std::allocator<char>::~allocator(&local_188);
  std::allocator<char>::~allocator(&local_187);
  std::allocator<char>::~allocator(&local_186);
  std::allocator<char>::~allocator(&local_185);
  std::allocator<char>::~allocator(&local_184);
  std::allocator<char>::~allocator(&local_183);
  std::allocator<char>::~allocator(&local_182);
  std::allocator<char>::~allocator(&local_181);
  for (local_198 = 0; local_198 < 8; local_198 = local_198 + 1) {
    std::operator+(&local_1b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   shader_start_abi_cxx11_);
    std::__cxx11::string::operator=
              ((string *)(variable_declaration.field_2._M_local_buf + 8),(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cs,"    ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&variable_initializations[local_198 - 1].field_2 + 8));
    std::__cxx11::string::operator+=
              ((string *)(variable_declaration.field_2._M_local_buf + 8),(string *)&cs);
    std::__cxx11::string::~string((string *)&cs);
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
      break;
    case VERTEX_SHADER_TYPE:
      std::__cxx11::string::operator+=
                ((string *)(variable_declaration.field_2._M_local_buf + 8),
                 "\n\tgl_Position = vec4(0.0);\n");
      break;
    case COMPUTE_SHADER_TYPE:
      break;
    case GEOMETRY_SHADER_TYPE:
      std::__cxx11::string::operator+=
                ((string *)(variable_declaration.field_2._M_local_buf + 8),
                 (string *)emit_quad_abi_cxx11_);
      break;
    case TESSELATION_CONTROL_SHADER_TYPE:
      std::__cxx11::string::operator+=
                ((string *)(variable_declaration.field_2._M_local_buf + 8),
                 (string *)set_tesseation_abi_cxx11_);
      break;
    case TESSELATION_EVALUATION_SHADER_TYPE:
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xc7f);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=
              ((string *)(variable_declaration.field_2._M_local_buf + 8),
               (string *)shader_end_abi_cxx11_);
    vs = (string *)empty_string_abi_cxx11_;
    tcs = (string *)default_vertex_shader_source_abi_cxx11_;
    tes = (string *)default_tc_shader_source_abi_cxx11_;
    gs = (string *)default_te_shader_source_abi_cxx11_;
    fs = (string *)default_geometry_shader_source_abi_cxx11_;
    local_208 = default_fragment_shader_source_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
      local_208 = (undefined1 *)((long)&variable_declaration.field_2 + 8);
      break;
    case VERTEX_SHADER_TYPE:
      tcs = (string *)((long)&variable_declaration.field_2 + 8);
      break;
    case COMPUTE_SHADER_TYPE:
      vs = (string *)((long)&variable_declaration.field_2 + 8);
      tcs = (string *)empty_string_abi_cxx11_;
      tes = (string *)empty_string_abi_cxx11_;
      gs = (string *)empty_string_abi_cxx11_;
      fs = (string *)empty_string_abi_cxx11_;
      local_208 = empty_string_abi_cxx11_;
      break;
    case GEOMETRY_SHADER_TYPE:
      fs = (string *)((long)&variable_declaration.field_2 + 8);
      break;
    case TESSELATION_CONTROL_SHADER_TYPE:
      tes = (string *)((long)&variable_declaration.field_2 + 8);
      break;
    case TESSELATION_EVALUATION_SHADER_TYPE:
      gs = (string *)((long)&variable_declaration.field_2 + 8);
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xc82);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[10])(this,tcs,tes,gs,fs,local_208,vs,1,0);
  }
  local_2d8 = (string *)(variable_initializations[7].field_2._M_local_buf + 8);
  do {
    local_2d8 = local_2d8 + -0x20;
    std::__cxx11::string::~string(local_2d8);
  } while (local_2d8 != local_178);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(variable_declaration.field_2._M_local_buf + 8));
  return;
}

Assistant:

void ExpressionsIndexingArray1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string shader_source;
	std::string variable_declaration = "float x[1][1][1][1][1][1][1][1];\n\n";

	std::string variable_initializations[] = {
		"x[0]                      = float[1][1][1][1][1][1][1]("
		"float[1][1][1][1][1][1](float[1][1][1][1][1](float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0)))))));"
		"\n",
		"x[0][0]                   = "
		"float[1][1][1][1][1][1](float[1][1][1][1][1](float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0))))));"
		"\n",
		"x[0][0][0]                = "
		"float[1][1][1][1][1](float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0)))));\n",
		"x[0][0][0][0]             = float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0))));\n",
		"x[0][0][0][0][0]          = float[1][1][1](float[1][1](float[1](1.0)));\n",
		"x[0][0][0][0][0][0]       = float[1][1](float[1](1.0));\n", "x[0][0][0][0][0][0][0]    = float[1](1.0);\n",
		"x[0][0][0][0][0][0][0][0] = 1.0;\n"
	};

	for (size_t string_index = 0; string_index < sizeof(variable_initializations) / sizeof(variable_initializations[0]);
		 string_index++)
	{
		shader_source = variable_declaration + shader_start;
		shader_source += "    " + variable_initializations[string_index];

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int string_index = 0; ...) */
}